

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

Option<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
* __thiscall
Lib::
IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>
::tryNext(Option<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
          *__return_storage_ptr__,
         IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>
         *this)

{
  int iVar1;
  undefined4 extraout_var;
  Lhs *extraout_RDX;
  bool bVar2;
  
  iVar1 = (*((this->_iter)._core)->_vptr_IteratorCore[2])();
  bVar2 = (char)iVar1 == '\0';
  if (bVar2) {
    *(undefined8 *)
     &__return_storage_ptr__->
      super_OptionBase<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
         = 0;
    (__return_storage_ptr__->
    super_OptionBase<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
    )._elem._elem.init.unifier = (AbstractingUnifier *)0x0;
    (__return_storage_ptr__->
    super_OptionBase<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
    )._elem._elem.init.data = (Lhs *)0x0;
  }
  else {
    iVar1 = (*((this->_iter)._core)->_vptr_IteratorCore[3])();
    (__return_storage_ptr__->
    super_OptionBase<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
    )._elem._elem.init.unifier = (AbstractingUnifier *)CONCAT44(extraout_var,iVar1);
    (__return_storage_ptr__->
    super_OptionBase<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
    )._elem._elem.init.data = extraout_RDX;
  }
  (__return_storage_ptr__->
  super_OptionBase<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
  )._isSome = !bVar2;
  return __return_storage_ptr__;
}

Assistant:

Option<Elem> tryNext() 
  { 
    return _iter.hasNext() 
        ? Option<Elem>(move_if_value<Elem>(_iter.next()))
        : Option<Elem>();
  }